

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall irr::video::COpenGL3DriverBase::setRenderStates3DMode(COpenGL3DriverBase *this)

{
  E_MATERIAL_TYPE EVar1;
  pointer pSVar2;
  IMaterialRenderer *pIVar3;
  bool bVar4;
  long lVar5;
  
  if (this->LockRenderStateMode != false) {
    return;
  }
  if (this->CurrentRenderMode == ERM_3D) {
    if (((this->ResetRenderStates & 1U) == 0) &&
       (bVar4 = SMaterial::operator!=(&this->LastMaterial,&this->Material), !bVar4))
    goto LAB_0020bfc2;
  }
  else {
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::setBlend(this->CacheHandler,false);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::setBlendFunc(this->CacheHandler,0x302,0x303);
    this->ResetRenderStates = true;
  }
  if ((this->CurrentRenderMode == ERM_2D) &&
     (this->MaterialRenderer2DActive != (COpenGL3Renderer2D *)0x0)) {
    (*(this->MaterialRenderer2DActive->super_COpenGL3MaterialRenderer).super_IMaterialRenderer.
      _vptr_IMaterialRenderer[2])();
    this->MaterialRenderer2DActive = (COpenGL3Renderer2D *)0x0;
  }
  else {
    EVar1 = (this->LastMaterial).MaterialType;
    if (EVar1 != (this->Material).MaterialType) {
      pSVar2 = (this->super_CNullDriver).MaterialRenderers.m_data.
               super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(this->super_CNullDriver).MaterialRenderers.m_data.
                    super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
      if (EVar1 < (E_MATERIAL_TYPE)(lVar5 / 0x28)) {
        (*(pSVar2[EVar1].Renderer)->_vptr_IMaterialRenderer[2])
                  (pSVar2[EVar1].Renderer,pSVar2,lVar5 % 0x28);
      }
    }
  }
  EVar1 = (this->Material).MaterialType;
  pSVar2 = (this->super_CNullDriver).MaterialRenderers.m_data.
           super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (EVar1 < (E_MATERIAL_TYPE)
              (((long)(this->super_CNullDriver).MaterialRenderers.m_data.
                      super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x28)) {
    pIVar3 = pSVar2[EVar1].Renderer;
    (**pIVar3->_vptr_IMaterialRenderer)
              (pIVar3,&this->Material,&this->LastMaterial,(ulong)this->ResetRenderStates,
               &(this->super_CNullDriver).field_0x490);
  }
  SMaterial::operator=(&this->LastMaterial,&this->Material);
  COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  ::correctCacheMaterial(this->CacheHandler,&this->LastMaterial);
  this->ResetRenderStates = false;
LAB_0020bfc2:
  EVar1 = (this->Material).MaterialType;
  pSVar2 = (this->super_CNullDriver).MaterialRenderers.m_data.
           super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (EVar1 < (E_MATERIAL_TYPE)
              (((long)(this->super_CNullDriver).MaterialRenderers.m_data.
                      super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x28)) {
    pIVar3 = pSVar2[EVar1].Renderer;
    (*pIVar3->_vptr_IMaterialRenderer[1])(pIVar3,&(this->super_CNullDriver).field_0x490,0);
  }
  this->CurrentRenderMode = ERM_3D;
  return;
}

Assistant:

void COpenGL3DriverBase::setRenderStates3DMode()
{
	if (LockRenderStateMode)
		return;

	if (CurrentRenderMode != ERM_3D) {
		// Reset Texture Stages
		CacheHandler->setBlend(false);
		CacheHandler->setBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

		ResetRenderStates = true;
	}

	if (ResetRenderStates || LastMaterial != Material) {
		// unset old material

		// unset last 3d material
		if (CurrentRenderMode == ERM_2D && MaterialRenderer2DActive) {
			MaterialRenderer2DActive->OnUnsetMaterial();
			MaterialRenderer2DActive = 0;
		} else if (LastMaterial.MaterialType != Material.MaterialType &&
				   static_cast<u32>(LastMaterial.MaterialType) < MaterialRenderers.size())
			MaterialRenderers[LastMaterial.MaterialType].Renderer->OnUnsetMaterial();

		// set new material.
		if (static_cast<u32>(Material.MaterialType) < MaterialRenderers.size())
			MaterialRenderers[Material.MaterialType].Renderer->OnSetMaterial(
					Material, LastMaterial, ResetRenderStates, this);

		LastMaterial = Material;
		CacheHandler->correctCacheMaterial(LastMaterial);
		ResetRenderStates = false;
	}

	if (static_cast<u32>(Material.MaterialType) < MaterialRenderers.size())
		MaterialRenderers[Material.MaterialType].Renderer->OnRender(this, video::EVT_STANDARD);

	CurrentRenderMode = ERM_3D;
}